

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O3

int parseInteger(char *str,int start,int len)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ushort **ppuVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  
  iVar5 = 0;
  if ((0 < len && -1 < start) && str != (char *)0x0) {
    pcVar8 = str + (uint)start;
    uVar7 = len + 1;
    bVar2 = false;
    bVar3 = false;
    iVar9 = 0;
    while( true ) {
      cVar1 = *pcVar8;
      if ((long)cVar1 == 0) break;
      if ((byte)(cVar1 - 0x30U) < 10) {
        iVar9 = (uint)(byte)(cVar1 - 0x30U) + iVar9 * 10;
        bVar4 = true;
      }
      else if ((bVar2) || (bVar4 = true, cVar1 != '+')) {
        if ((bVar2) || (cVar1 != '-')) {
          ppuVar6 = __ctype_b_loc();
          if ((bVar2) || (bVar4 = false, ((*ppuVar6)[cVar1] & 0x2000) == 0)) break;
        }
        else {
          bVar3 = true;
          bVar4 = true;
        }
      }
      bVar2 = bVar4;
      pcVar8 = pcVar8 + 1;
      uVar7 = uVar7 - 1;
      if (uVar7 < 2) break;
    }
    iVar5 = -iVar9;
    if (!bVar3) {
      iVar5 = iVar9;
    }
  }
  return iVar5;
}

Assistant:

int parseInteger(char *str, int start, int len) {
   register int value = 0;
   register char ch;
   int neg = 0, inside = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10*value) + (ch - '0');
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 neg = 1;
	 inside = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of integer */
   }
   return (neg?-value:value);
}